

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::OP1aHeader::Dump(OP1aHeader *this,FILE *stream)

{
  long *plVar1;
  PacketList *pPVar2;
  PacketList *pPVar3;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  Partition::Dump(&this->super_Partition,stream);
  Primer::Dump(&this->m_Primer,stream);
  if (this->m_Preface == (Preface *)0x0) {
    fputs("No Preface loaded\n",(FILE *)stream);
  }
  pPVar2 = (this->super_Partition).m_PacketList.m_p;
  pPVar3 = pPVar2;
  while (pPVar3 = (PacketList *)
                  (pPVar3->m_List).
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pPVar3 != pPVar2) {
    plVar1 = (long *)(pPVar3->m_List).
                     super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     ._M_impl._M_node._M_size;
    (**(code **)(*plVar1 + 0x88))(plVar1,stream);
    pPVar2 = (this->super_Partition).m_PacketList.m_p;
  }
  return;
}

Assistant:

void
ASDCP::MXF::OP1aHeader::Dump(FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  Partition::Dump(stream);
  m_Primer.Dump(stream);

  if ( m_Preface == 0 )
    fputs("No Preface loaded\n", stream);

  std::list<InterchangeObject*>::iterator i = m_PacketList->m_List.begin();
  for ( ; i != m_PacketList->m_List.end(); i++ )
    (*i)->Dump(stream);
}